

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArrayBase::SetProperty
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ScriptContext *this_00;
  uint32 uVar1;
  BOOL BVar2;
  PropertyRecord *this_01;
  PropertyString *aValue;
  double local_40;
  double result;
  
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  result = (double)info;
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  if (this_01->isNumeric == true) {
    uVar1 = PropertyRecord::GetNumericValue(this_01);
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
              (this,(ulong)uVar1,value);
    BVar2 = 1;
  }
  else {
    if (this_01->isSymbol == false) {
      aValue = ScriptContext::GetPropertyString(this_00,propertyId);
      BVar2 = JavascriptConversion::CanonicalNumericIndexString
                        (&aValue->super_JavascriptString,&local_40,this_00);
      if (BVar2 != 0) {
        return 0;
      }
    }
    BVar2 = DynamicObject::SetProperty
                      ((DynamicObject *)this,propertyId,value,flags,(PropertyValueInfo *)result);
  }
  return BVar2;
}

Assistant:

BOOL TypedArrayBase::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext *scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            this->DirectSetItem(propertyRecord->GetNumericValue(), value);
            return true;
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }
        else
        {
            return DynamicObject::SetProperty(propertyId, value, flags, info);
        }
    }